

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  U32 UVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar3 = 0x10;
  if ((size & 0xf) != 0) {
    __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3177,
                  "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
  }
  if (-1 < (int)size) {
    iVar4 = 0;
    for (iVar2 = 0; iVar2 != (int)size / 0x10; iVar2 = iVar2 + 1) {
      for (lVar5 = (long)iVar4; iVar3 != lVar5; lVar5 = lVar5 + 1) {
        UVar1 = table[lVar5] - reducerValue;
        if (table[lVar5] < reducerValue) {
          UVar1 = 0;
        }
        table[lVar5] = UVar1;
      }
      iVar3 = iVar3 + 0x10;
      iVar4 = iVar4 + 0x10;
    }
    return;
  }
  __assert_fail("size < (1U<<31)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x3178,
                "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}